

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void IT8951HostAreaPackedPixelWrite(IT8951LdImgInfo *pstLdImgInfo,IT8951AreaImgInfo *pstAreaImgInfo)

{
  uint16_t *local_28;
  uint16_t *pusFrameBuf;
  uint32_t j;
  uint32_t i;
  IT8951AreaImgInfo *pstAreaImgInfo_local;
  IT8951LdImgInfo *pstLdImgInfo_local;
  
  local_28 = (uint16_t *)(ulong)pstLdImgInfo->ulStartFBAddr;
  IT8951SetImgBufBaseAddr(pstLdImgInfo->ulImgBufBaseAddr);
  IT8951LoadImgAreaStart(pstLdImgInfo,pstAreaImgInfo);
  for (pusFrameBuf._0_4_ = 0; (uint)pusFrameBuf < pstAreaImgInfo->usHeight;
      pusFrameBuf._0_4_ = (uint)pusFrameBuf + 1) {
    for (pusFrameBuf._4_4_ = 0; pusFrameBuf._4_4_ < pstAreaImgInfo->usWidth / 2;
        pusFrameBuf._4_4_ = pusFrameBuf._4_4_ + 1) {
      LCDWriteData(*local_28);
      local_28 = local_28 + 1;
    }
  }
  IT8951LoadImgEnd();
  return;
}

Assistant:

void IT8951HostAreaPackedPixelWrite(IT8951LdImgInfo* pstLdImgInfo,IT8951AreaImgInfo* pstAreaImgInfo)
{
	uint32_t i,j;
	//Source buffer address of Host
	uint16_t* pusFrameBuf = (uint16_t*)pstLdImgInfo->ulStartFBAddr;

	//Set Image buffer(IT8951) Base address
	IT8951SetImgBufBaseAddr(pstLdImgInfo->ulImgBufBaseAddr);
	//Send Load Image start Cmd
	IT8951LoadImgAreaStart(pstLdImgInfo , pstAreaImgInfo);
	//Host Write Data
	for(j=0;j< pstAreaImgInfo->usHeight;j++)
	{
		 for(i=0;i< pstAreaImgInfo->usWidth/2;i++)
			{
					//Write a Word(2-Bytes) for each time
					LCDWriteData(*pusFrameBuf);
					pusFrameBuf++;
			}
	}
	//Send Load Img End Command
	IT8951LoadImgEnd();
}